

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O0

int doopen(int dx,int dy,int dz)

{
  boolean bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  monst *local_58;
  obj *local_50;
  obj *otmp;
  char *pcStack_40;
  int locked;
  char *mesg;
  schar unused;
  monst *pmStack_30;
  boolean got_dir;
  monst *mtmp;
  rm *door;
  int local_18;
  int iStack_14;
  coord cc;
  int dz_local;
  int dy_local;
  int dx_local;
  
  mesg._7_1_ = '\0';
  local_18 = dz;
  iStack_14 = dy;
  if (((youmonst.data)->mflags1 & 0x2000) == 0) {
    if ((u.utrap == 0) || (u.utraptype != 1)) {
      if (((dx != -2) && (dy != -2)) && (dz != -2)) {
        door._6_1_ = u.ux + (char)dx;
        door._7_1_ = u.uy + (char)dy;
        if ((('\0' < door._6_1_) && (door._6_1_ < 'P')) &&
           ((-1 < door._7_1_ && (door._7_1_ < '\x15')))) {
          mesg._7_1_ = '\x01';
        }
      }
      if ((mesg._7_1_ == '\0') &&
         (iVar2 = get_adjacent_loc((char *)0x0,(char *)0x0,u.ux,u.uy,(coord *)((long)&door + 6),
                                   (schar *)((long)&mesg + 6)), iVar2 == 0)) {
        dy_local = 0;
      }
      else {
        dz_local = dx;
        if (mesg._7_1_ == '\0') {
          dz_local = (int)door._6_1_ - (int)u.ux;
          iStack_14 = (int)door._7_1_ - (int)u.uy;
          local_18 = 0;
        }
        if ((door._6_1_ == u.ux) && (door._7_1_ == u.uy)) {
          dy_local = 0;
        }
        else {
          if ((level->monsters[door._6_1_][door._7_1_] == (monst *)0x0) ||
             ((*(uint *)&level->monsters[door._6_1_][door._7_1_]->field_0x60 >> 9 & 1) != 0)) {
            local_58 = (monst *)0x0;
          }
          else {
            local_58 = level->monsters[door._6_1_][door._7_1_];
          }
          pmStack_30 = local_58;
          if ((((local_58 == (monst *)0x0) || (local_58->m_ap_type != '\x01')) ||
              ((local_58->mappearance != 0x1c && (local_58->mappearance != 0x1b)))) ||
             ((u.uprops[0x17].intrinsic != 0 || (u.uprops[0x17].extrinsic != 0)))) {
            mtmp = (monst *)(level->locations[door._6_1_] + door._7_1_);
            if (*(schar *)((long)&mtmp->nmon + 4) == '\x17') {
              if ((*(uint *)((long)&mtmp->nmon + 6) >> 4 & 0x1f) == 2) {
                dy_local = doclose(dz_local,iStack_14,local_18);
              }
              else if ((*(uint *)((long)&mtmp->nmon + 6) >> 4 & 4) == 0) {
                bVar5 = false;
                uVar3 = *(uint *)((long)&mtmp->nmon + 6) >> 4 & 0x1f;
                if (uVar3 == 0) {
                  pcStack_40 = "way has no door";
                }
                else if (uVar3 == 1) {
                  pcStack_40 = " is broken";
                }
                else if (uVar3 == 2) {
                  pcStack_40 = " is already open";
                }
                else {
                  *(uint *)((long)&mtmp->nmon + 6) =
                       *(uint *)((long)&mtmp->nmon + 6) & 0xfffffffe | 1;
                  map_background(door._6_1_,door._7_1_,1);
                  pcStack_40 = " is locked";
                  bVar5 = true;
                }
                pline("This door%s.",pcStack_40);
                if ((((u.uprops[0x1e].intrinsic != 0) ||
                     ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
                    (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
                   ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
                  feel_location(door._6_1_,door._7_1_);
                }
                if ((((bVar5) && (flags.run == 0)) && (flags.autounlock != '\0')) &&
                   (((local_50 = carrying(0xe2), local_50 != (obj *)0x0 ||
                     (local_50 = carrying(0xe3), local_50 != (obj *)0x0)) ||
                    (local_50 = carrying(0xe4), local_50 != (obj *)0x0)))) {
                  dy_local = pick_lock(local_50,(int)door._6_1_,(int)door._7_1_,'\x01','\0');
                }
                else {
                  dy_local = 0;
                }
              }
              else if ((youmonst.data)->msize == '\0') {
                pline("You\'re too small to pull the door open.");
                dy_local = 0;
              }
              else {
                pline("The door opens.");
                if ((*(uint *)((long)&mtmp->nmon + 6) >> 4 & 0x10) == 0) {
                  *(uint *)((long)&mtmp->nmon + 6) =
                       *(uint *)((long)&mtmp->nmon + 6) & 0xfffffe0f | 0x20;
                }
                else {
                  b_trapped("door",3);
                  *(uint *)((long)&mtmp->nmon + 6) = *(uint *)((long)&mtmp->nmon + 6) & 0xfffffe0f;
                  pcVar4 = in_rooms(level,door._6_1_,door._7_1_,0x12);
                  if (*pcVar4 != '\0') {
                    add_damage(door._6_1_,door._7_1_,0);
                  }
                }
                if (((u.uprops[0x1e].intrinsic == 0) &&
                    (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                     (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                   ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
                  newsym((int)door._6_1_,(int)door._7_1_);
                }
                else {
                  feel_location(door._6_1_,door._7_1_);
                }
                unblock_point((int)door._6_1_,(int)door._7_1_);
                dy_local = 1;
              }
            }
            else {
              bVar1 = is_db_wall((int)door._6_1_,(int)door._7_1_);
              if (bVar1 == '\0') {
                if (((u.uprops[0x1e].intrinsic != 0) ||
                    ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
                   (bVar5 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)) {
                  bVar5 = false;
                  if (ublindf != (obj *)0x0) {
                    bVar5 = ublindf->oartifact == '\x1d';
                  }
                  bVar5 = (bool)(bVar5 ^ 1);
                }
                pcVar4 = "not see";
                if (bVar5) {
                  pcVar4 = "You feel";
                }
                pline("You %s no door there.",pcVar4 + 4);
                dy_local = 0;
              }
              else {
                pline("There is no obvious way to open the drawbridge.");
                dy_local = 0;
              }
            }
          }
          else {
            stumble_onto_mimic(local_58,door._6_1_ - u.ux,door._7_1_ - u.uy);
            dy_local = 1;
          }
        }
      }
    }
    else {
      pline("You can\'t reach over the edge of the pit.");
      dy_local = 0;
    }
  }
  else {
    pline("You can\'t open, close, or unlock anything -- you have no hands!");
    dy_local = 0;
  }
  return dy_local;
}

Assistant:

int doopen(int dx, int dy, int dz)
{
	coord cc;
	struct rm *door;
	struct monst *mtmp;
	boolean got_dir = FALSE;
	schar unused;

	if (nohands(youmonst.data)) {
	    pline("You can't open, close, or unlock anything -- you have no hands!");
	    return 0;
	}

	if (u.utrap && u.utraptype == TT_PIT) {
	    pline("You can't reach over the edge of the pit.");
	    return 0;
	}
	
	if (dx != -2 && dy != -2 && dz != -2) { /* -2 signals no direction given  */
	    cc.x = u.ux + dx;
	    cc.y = u.uy + dy;
	    if (isok(cc.x, cc.y))
		got_dir = TRUE;
	}

	if (!got_dir && !get_adjacent_loc(NULL, NULL, u.ux, u.uy, &cc, &unused))
	    return 0;

        if (!got_dir) {
            dx = cc.x-u.ux;
            dy = cc.y-u.uy;
            dz = 0;
        }

	if ((cc.x == u.ux) && (cc.y == u.uy))
	    return 0;

	if ((mtmp = m_at(level, cc.x,cc.y))		&&
		mtmp->m_ap_type == M_AP_FURNITURE	&&
		(mtmp->mappearance == S_hcdoor ||
			mtmp->mappearance == S_vcdoor)	&&
		!Protection_from_shape_changers)	 {

	    stumble_onto_mimic(mtmp, cc.x-u.ux, cc.y-u.uy);
	    return 1;
	}

	door = &level->locations[cc.x][cc.y];

	if (!IS_DOOR(door->typ)) {
		if (is_db_wall(cc.x,cc.y)) {
		    pline("There is no obvious way to open the drawbridge.");
		    return 0;
		}
		pline("You %s no door there.",
				Blind ? "feel" : "see");
		return 0;
	}

        if (door->doormask == D_ISOPEN)
            return doclose(dx, dy, dz);

	if (!(door->doormask & D_CLOSED)) {
	    const char *mesg;
	    int locked = FALSE;

	    switch (door->doormask) {
	    case D_BROKEN: mesg = " is broken"; break;
	    case D_NODOOR: mesg = "way has no door"; break;
	    case D_ISOPEN: mesg = " is already open"; break;
	    default:
		door->mem_door_l = 1;
		map_background(cc.x, cc.y, TRUE);
		mesg = " is locked";
		locked = TRUE;
		break;
	    }
	    pline("This door%s.", mesg);
	    if (Blind) feel_location(cc.x,cc.y);
	    if (locked && !flags.run) {
		struct obj *otmp = NULL;
		if (flags.autounlock &&
		    ((otmp = carrying(SKELETON_KEY)) ||
		     (otmp = carrying(LOCK_PICK)) ||
		     (otmp = carrying(CREDIT_CARD))))
		    return pick_lock(otmp, cc.x, cc.y, TRUE, FALSE);
	    }
	    return 0;
	}

	if (verysmall(youmonst.data)) {
	    pline("You're too small to pull the door open.");
	    return 0;
	}

	/* door is known to be CLOSED */
	pline("The door opens.");
	if (door->doormask & D_TRAPPED) {
	    b_trapped("door", FINGER);
	    door->doormask = D_NODOOR;
	    if (*in_rooms(level, cc.x, cc.y, SHOPBASE)) add_damage(cc.x, cc.y, 0L);
	} else
	    door->doormask = D_ISOPEN;
	if (Blind)
	    feel_location(cc.x,cc.y);	/* the hero knows she opened it  */
	else
	    newsym(cc.x,cc.y);
	unblock_point(cc.x,cc.y);	/* vision: new see through there */

	return 1;
}